

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O2

InlineeFrameRecord * __thiscall InlineeFrameRecord::Reverse(InlineeFrameRecord *this)

{
  InlineeFrameRecord *pIVar1;
  InlineeFrameRecord *pIVar2;
  
  pIVar2 = (InlineeFrameRecord *)0x0;
  while (this != (InlineeFrameRecord *)0x0) {
    pIVar1 = this->parent;
    this->parent = pIVar2;
    pIVar2 = this;
    this = pIVar1;
  }
  return pIVar2;
}

Assistant:

InlineeFrameRecord* InlineeFrameRecord::Reverse()
{
    InlineeFrameRecord * prev = nullptr;
    InlineeFrameRecord * current = this;
    while (current)
    {
        InlineeFrameRecord * next = current->parent;
        current->parent = prev;
        prev = current;
        current = next;
    }
    return prev;
}